

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceDecomposition::unpackPreForceData(ForceDecomposition *this,SelfData *sdat,int atom)

{
  uint uVar1;
  pointer pdVar2;
  uint i;
  long lVar3;
  
  if (&this->selfPot != &sdat->selfPot) {
    lVar3 = 0;
    do {
      (this->selfPot).data_[lVar3] = (sdat->selfPot).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  if (&this->selectedSelfPot != &sdat->selePot) {
    lVar3 = 0;
    do {
      (this->selectedSelfPot).data_[lVar3] = (sdat->selePot).data_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
  }
  uVar1 = this->atomStorageLayout_;
  if ((uVar1 >> 8 & 1) != 0) {
    pdVar2 = (this->snap_->atomData).functional.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar2[atom] = sdat->frho + pdVar2[atom];
  }
  if ((uVar1 >> 9 & 1) != 0) {
    pdVar2 = (this->snap_->atomData).functionalDerivative.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar2[atom] = sdat->dfrhodrho + pdVar2[atom];
  }
  if (((uVar1 & 0x40) != 0) && (sdat->doParticlePot != false)) {
    (this->snap_->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[atom] = sdat->particlePot;
  }
  return;
}

Assistant:

void ForceDecomposition::unpackPreForceData(SelfData& sdat, int atom) {
    selfPot         = sdat.selfPot;
    selectedSelfPot = sdat.selePot;

    if (atomStorageLayout_ & DataStorage::dslFunctional) {
      snap_->atomData.functional[atom] += sdat.frho;
    }

    if (atomStorageLayout_ & DataStorage::dslFunctionalDerivative) {
      snap_->atomData.functionalDerivative[atom] += sdat.dfrhodrho;
    }

    if (sdat.doParticlePot &&
        (atomStorageLayout_ & DataStorage::dslParticlePot)) {
      snap_->atomData.particlePot[atom] = sdat.particlePot;
    }
  }